

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

void __thiscall flow::BasicBlock::BasicBlock(BasicBlock *this,string *name,IRHandler *parent)

{
  Value::Value(&this->super_Value,Void,name);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__BasicBlock_001af548;
  this->handler_ = parent;
  (this->code_).
  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->code_).
  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->code_).
  super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->predecessors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predecessors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predecessors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->successors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->successors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->successors_).super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

BasicBlock::BasicBlock(const std::string& name, IRHandler* parent)
    : Value(LiteralType::Void, name),
      handler_(parent),
      code_(),
      predecessors_(),
      successors_() {
}